

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimera.hpp
# Opt level: O1

double * __thiscall
openjij::graph::Chimera<double>::J(Chimera<double> *this,size_t r,size_t c,size_t i,ChimeraDir dir)

{
  Index i_00;
  Index j;
  double *pdVar1;
  
  if (this->_num_row <= r) {
    __assert_fail("r < _num_row",
                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                  ,0x163,
                  "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
                 );
  }
  if (c < this->_num_column) {
    if (7 < i) {
      __assert_fail("i < _num_in_chimera",
                    "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                    ,0x165,
                    "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
                   );
    }
    switch(dir) {
    case PLUS_R:
      if (3 < i) {
        __assert_fail("i < 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                      ,0x171,
                      "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
                     );
      }
      i_00 = to_ind(this,r,c,i);
      r = r + 1;
      break;
    case MINUS_R:
      if (3 < i) {
        __assert_fail("i < 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                      ,0x169,
                      "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
                     );
      }
      i_00 = to_ind(this,r,c,i);
      r = r - 1;
      break;
    case PLUS_C:
      if (i < 4) {
        __assert_fail("4 <= i",
                      "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                      ,0x175,
                      "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
                     );
      }
      i_00 = to_ind(this,r,c,i);
      c = c + 1;
      break;
    case MINUS_C:
      if (i < 4) {
        __assert_fail("4 <= i",
                      "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                      ,0x16d,
                      "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
                     );
      }
      i_00 = to_ind(this,r,c,i);
      c = c - 1;
      break;
    case IN_0or4:
      i_00 = to_ind(this,r,c,i);
      i = (ulong)(i < 4) << 2;
      break;
    case IN_1or5:
      i_00 = to_ind(this,r,c,i);
      i = (ulong)(i < 4) * 4 + 1;
      break;
    case IN_2or6:
      i_00 = to_ind(this,r,c,i);
      i = (ulong)(i < 4) * 4 + 2;
      break;
    case IN_3or7:
      i_00 = to_ind(this,r,c,i);
      i = (ulong)(i < 4) * 4 + 3;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                    ,0x187,
                    "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
                   );
    }
    j = to_ind(this,r,c,i);
    pdVar1 = Sparse<double>::J(&this->super_Sparse<double>,i_00,j);
    return pdVar1;
  }
  __assert_fail("c < _num_column",
                "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/chimera.hpp"
                ,0x164,
                "FloatType &openjij::graph::Chimera<>::J(std::size_t, std::size_t, std::size_t, ChimeraDir) [FloatType = double]"
               );
}

Assistant:

FloatType &J(std::size_t r, std::size_t c, std::size_t i, ChimeraDir dir) {
    assert(r < _num_row);
    assert(c < _num_column);
    assert(i < _num_in_chimera);

    switch (dir) {
    case ChimeraDir::MINUS_R:
      assert(i < 4);
      return this->Sparse<FloatType>::J(
          to_ind(r, c, i), to_ind(static_cast<std::int64_t>(r) - 1, c, i));
    case ChimeraDir::MINUS_C:
      assert(4 <= i);
      return this->Sparse<FloatType>::J(
          to_ind(r, c, i), to_ind(r, static_cast<std::int64_t>(c) - 1, i));
    case ChimeraDir::PLUS_R:
      assert(i < 4);
      return this->Sparse<FloatType>::J(
          to_ind(r, c, i), to_ind(static_cast<std::int64_t>(r) + 1, c, i));
    case ChimeraDir::PLUS_C:
      assert(4 <= i);
      return this->Sparse<FloatType>::J(
          to_ind(r, c, i), to_ind(r, static_cast<std::int64_t>(c) + 1, i));

    case ChimeraDir::IN_0or4:
      return this->Sparse<FloatType>::J(to_ind(r, c, i),
                                        to_ind(r, c, (i < 4) ? 4 : 0));
    case ChimeraDir::IN_1or5:
      return this->Sparse<FloatType>::J(to_ind(r, c, i),
                                        to_ind(r, c, (i < 4) ? 5 : 1));
    case ChimeraDir::IN_2or6:
      return this->Sparse<FloatType>::J(to_ind(r, c, i),
                                        to_ind(r, c, (i < 4) ? 6 : 2));
    case ChimeraDir::IN_3or7:
      return this->Sparse<FloatType>::J(to_ind(r, c, i),
                                        to_ind(r, c, (i < 4) ? 7 : 3));

    default:
      assert(false);
      return _init_val;
    }
  }